

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O0

int function_decrement_reference(function_conflict func)

{
  int iVar1;
  long in_RDI;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = threading_atomic_ref_count_decrement((threading_atomic_ref_count)(in_RDI + 0x20));
    if (iVar1 == 1) {
      local_4 = 1;
    }
    else {
      LOCK();
      function_stats.decrements = function_stats.decrements + 1;
      UNLOCK();
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int function_decrement_reference(function func)
{
	if (func == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_decrement(&func->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_decrement(function_stats);

	return 0;
}